

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t astNode_;
  size_t i;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_tuple_t *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &local_88;
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 7;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_88 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x28));
  sVar4 = *arguments;
  if (*(sysbvm_tuple_t *)(sVar4 + 0x30) != 0) {
    sStack_80 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                           *(sysbvm_tuple_t *)(sVar4 + 0x30));
    sVar4 = *arguments;
  }
  local_78 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(sVar4 + 0x38));
  uVar1 = *(ulong *)(*arguments + 0x40);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar4 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    sVar4 = 0;
  }
  sStack_70 = sysbvm_array_create(context,sVar4);
  for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x40);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      astNode_ = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar5 * 8);
    }
    else {
      astNode_ = 0;
    }
    local_68 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],astNode_);
    if ((sStack_70 & 0xf) == 0 && sStack_70 != 0) {
      *(sysbvm_tuple_t *)(sStack_70 + 0x10 + sVar5 * 8) = local_68;
    }
  }
  sVar4 = *(sysbvm_tuple_t *)(*arguments + 0x20);
  _Var2 = sysbvm_type_isDirectSubtypeOf(sVar4,(context->roots).voidType);
  _Var3 = sysbvm_type_isDirectSubtypeOf(sVar4,(context->roots).controlFlowEscapeType);
  if (_Var2) {
    sStack_60 = 0;
    local_58 = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f
                         );
  }
  else {
    local_58 = sysbvm_functionBytecodeAssembler_newTemporary
                         (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                          sVar4);
    sStack_60 = local_58;
  }
  if (*(long *)(*arguments + 0x30) == 0) {
    sysbvm_functionBytecodeAssembler_send
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_60,
               local_78,local_88,sStack_70);
  }
  else {
    sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_60,
               sStack_80,local_78,local_88,sStack_70);
  }
  if (_Var3) {
    sysbvm_functionBytecodeAssembler_unreachable
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10));
  }
  sysbvm_stackFrame_popRecord(&local_48);
  return local_58;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;
    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverLookupType;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t resultTemporary;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.receiver = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->receiver);
    if((*sendNode)->receiverLookupType)
        gcFrame.receiverLookupType = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->receiverLookupType);
    gcFrame.selector = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->selector);

    size_t sendArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    gcFrame.arguments = sysbvm_array_create(context, sendArgumentCount);
    for(size_t i = 0; i < sendArgumentCount; ++i)
    {
        gcFrame.argument = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, sysbvm_array_at((*sendNode)->arguments, i));
        sysbvm_array_atPut(gcFrame.arguments, i, gcFrame.argument);
    }

    bool isVoidType = sysbvm_type_isDirectSubtypeOf((*sendNode)->super.analyzedType, context->roots.voidType);
    bool isControlFlowEscape = sysbvm_type_isDirectSubtypeOf((*sendNode)->super.analyzedType, context->roots.controlFlowEscapeType);
    if(isVoidType)
    {
        gcFrame.resultTemporary = SYSBVM_NULL_TUPLE;
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    }
    else
    {
        gcFrame.resultTemporary = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*sendNode)->super.analyzedType);
        gcFrame.result = gcFrame.resultTemporary;
    }

    if((*sendNode)->receiverLookupType)
        sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.receiverLookupType, gcFrame.selector, gcFrame.receiver, gcFrame.arguments);
    else
        sysbvm_functionBytecodeAssembler_send(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.selector, gcFrame.receiver, gcFrame.arguments);

    if(isControlFlowEscape)
        sysbvm_functionBytecodeAssembler_unreachable(context, (*compiler)->assembler);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}